

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a6c120::EnvironmentMacroExpander::~EnvironmentMacroExpander
          (EnvironmentMacroExpander *this)

{
  EnvironmentMacroExpander *this_local;
  
  ~EnvironmentMacroExpander(this);
  operator_delete(this,8);
  return;
}

Assistant:

ExpandMacroResult operator()(const std::string& macroNamespace,
                               const std::string& macroName,
                               std::string& macroOut,
                               int /*version*/) const override
  {
    if (macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      if (cm::optional<std::string> value =
            cmSystemTools::GetEnvVar(macroName)) {
        macroOut += *value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  }